

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iRpn.cpp
# Opt level: O3

void __thiscall Imaginer::Utils::iRpn::Parser(iRpn *this)

{
  double __y;
  bool bVar1;
  uint uVar2;
  RPNnode *pRVar3;
  undefined1 uVar4;
  RPNnode *pRVar5;
  long lVar6;
  anon_union_8_2_93b31755_for__node *paVar7;
  ostream *poVar8;
  byte bVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  double dVar15;
  RPNnode curnode;
  anon_union_8_2_93b31755_for__node local_58;
  bool local_50;
  iStack<Imaginer::Utils::iRpn::RPNnode> local_48;
  iRpn *local_38;
  
  local_48._size = 0x400;
  local_48._top = -1;
  local_38 = this;
  pRVar5 = (RPNnode *)operator_new__(0x4000);
  lVar6 = 0;
  do {
    (&pRVar5->_is)[lVar6] = false;
    *(undefined8 *)((long)&pRVar5->_node + lVar6) = 0;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x4000);
  uVar2 = local_38->_operands->_top;
  local_50 = false;
  local_58._value = 0.0;
  local_48._data = pRVar5;
  if (-1 < (int)uVar2) {
    uVar14 = 0xffffffff;
    lVar6 = 0;
    do {
      pRVar3 = local_38->_operands->_data;
      if ((anon_union_8_2_93b31755_for__node *)((long)&pRVar3->_node + lVar6) != &local_58) {
        local_58 = *(anon_union_8_2_93b31755_for__node *)((long)&pRVar3->_node + lVar6);
        local_50 = (&pRVar3->_is)[lVar6];
      }
      iVar13 = (int)uVar14;
      if ((local_50 & 1U) == 0) {
        uVar4 = local_58._sign;
        lVar12 = (long)local_58._sign;
        if (((int)local_58._sign - 0x58U & 0xde) != 0) {
          if (local_58._sign < '\0') {
            if (0x94 < (byte)local_58._sign) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"no sunch Function: ",0x13);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
              std::ostream::put('\x10');
              std::ostream::flush();
              break;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Function: ",10);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,*(char **)(lVar12 * 0x20 + 0x10c550),
                                *(long *)(lVar12 * 0x20 + 0x10c558));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
          if (iVar13 < 1) goto LAB_001069ea;
          uVar10 = uVar14 & 0xffffffff;
          lVar12 = 0x12;
          if (pRVar5[uVar10]._is == false) {
            pcVar11 = "L cannot calculate";
switchD_0010691b_caseD_2:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,lVar12)
            ;
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
            std::ostream::put('\x10');
            std::ostream::flush();
            goto LAB_001069ea;
          }
          bVar1 = pRVar5[uVar10 - 1]._is;
          pcVar11 = "R cannot calculate";
          if (bVar1 == false) goto switchD_0010691b_caseD_2;
          __y = pRVar5[uVar10]._node._value;
          dVar15 = pRVar5[uVar10 - 1]._node._value;
          lVar12 = 0x10;
          pcVar11 = "invalid operator";
          switch(uVar4) {
          case 0x2a:
            dVar15 = __y * dVar15;
            break;
          case 0x2b:
            dVar15 = __y + dVar15;
            break;
          case 0x2c:
          case 0x2e:
            goto switchD_0010691b_caseD_2;
          case 0x2d:
            dVar15 = dVar15 - __y;
            break;
          case 0x2f:
            dVar15 = dVar15 / __y;
            break;
          default:
            if (uVar4 == 0x5e) {
              dVar15 = pow(dVar15,__y);
              break;
            }
            pcVar11 = "invalid operator";
            if (uVar4 != 0x5f) goto switchD_0010691b_caseD_2;
            pRVar5[uVar10 + 1]._node._value = dVar15;
            pRVar5[uVar10 + 1]._is = bVar1;
            uVar14 = (long)(iVar13 + 1) + 1;
            local_48._top = (int)uVar14;
            paVar7 = &local_48._data[uVar14]._node;
            local_48._data[uVar14]._node =
                 (anon_union_8_2_93b31755_for__node)(-__y & 0xffffffffffffff00);
            pRVar5 = local_48._data;
            goto LAB_00106a95;
          }
          uVar14 = (ulong)(iVar13 + 1U);
          local_48._top = iVar13 + 1U;
          paVar7 = &pRVar5[uVar10 + 1]._node;
          *paVar7 = (anon_union_8_2_93b31755_for__node)(dVar15 & 0xffffffffffffff00);
LAB_00106a95:
          bVar9 = 1;
          goto LAB_00106818;
        }
        uVar14 = (ulong)(iVar13 + 1U);
        local_48._top = iVar13 + 1U;
        if (&pRVar5[(long)iVar13 + 1]._node != &local_58) {
          pRVar5[(long)iVar13 + 1]._node = local_58;
          pRVar5[(long)iVar13 + 1]._is = local_50;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"unknowns nunber ",0x10);
        poVar8 = operator<<((ostream *)&std::cout,(RPNnode *)&local_58);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      else {
        uVar14 = (ulong)(iVar13 + 1U);
        local_48._top = iVar13 + 1U;
        paVar7 = &pRVar5[(long)iVar13 + 1]._node;
        if (paVar7 == &local_58) goto LAB_001069ea;
        *paVar7 = local_58;
        bVar9 = local_50;
LAB_00106818:
        paVar7[1]._sign = bVar9;
      }
LAB_001069ea:
      lVar6 = lVar6 + 0x10;
    } while ((ulong)uVar2 * 0x10 + 0x10 != lVar6);
  }
  poVar8 = operator<<((ostream *)&std::cout,&local_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (local_48._data != (RPNnode *)0x0) {
    operator_delete__(local_48._data);
  }
  return;
}

Assistant:

void iRpn::Parser()
{
    //genRpn();
    //_operands->reverse();
    iStack<RPNnode> result;
    int size = _operands->size();
    RPNnode curnode;
    char op = '\0';
    RPNnode  loperand;
    RPNnode  roperand;
    for(int i = 0;i <= size;++i)
    {
        curnode = (*_operands)[i];
        //std::cout << curnode << "\n";
        if(!curnode)//opearator
        {
            if(isVariable(curnode))
            {
                result.push(curnode);
                std::cout << "unknowns nunber " << curnode << std::endl;
            }
            else
            {
                op = curnode;
                if(op < 0)
                {
                    if(isFun(op))
                        std::cout << "Function: " << _sysfunS[op+128] << std::endl;
                    else
                    {
                        std::cout << "no sunch Function: " << std::endl;
                        break;
                    }
                }
                if(result.empty() || result.size() < 1)
                {
                    continue;
                }
                loperand = result[-1];
                roperand = result[-2];
                if(!loperand)
                {
                    std::cout << "L cannot calculate" << std::endl;
                    continue;
                }
                if(!roperand)
                {
                    std::cout << "R cannot calculate" << std::endl;
                    continue;
                }
                switch (op)
                {
                case '_':
                    result.push(roperand);
                    result.push(-loperand);
                    break;
                case '+':
                    result.push(roperand+loperand);
                    break;
                case '-':
                    result.push(roperand-loperand);
                    break;
                case '*':
                    result.push(roperand*loperand);
                    break;
                case '/':
                    result.push(roperand/loperand);
                    break;
                case '^':
                    result.push(pow(roperand,loperand));
                    break;
                default:
                    std::cout << "invalid operator" << std::endl;
                    break;
                }
            }
        }
        else//operand
        {
            result.push(curnode);
            //std::cout << curnode << "\n";
        }
    }
    std::cout << result << std::endl;
}